

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O0

t_soundfile_type * soundfile_findtype(char *name)

{
  int iVar1;
  t_soundfile_type *local_20;
  t_soundfile_type **local_18;
  t_soundfile_type **t;
  char *name_local;
  
  local_18 = soundfile_firsttype();
  while ((local_18 != (t_soundfile_type **)0x0 &&
         (iVar1 = strcmp(name,(*local_18)->t_name), iVar1 != 0))) {
    local_18 = soundfile_nexttype(local_18);
  }
  if (local_18 == (t_soundfile_type **)0x0) {
    local_20 = (t_soundfile_type *)0x0;
  }
  else {
    local_20 = *local_18;
  }
  return local_20;
}

Assistant:

static t_soundfile_type *soundfile_findtype(const char *name)
{
    t_soundfile_type **t = soundfile_firsttype();
    while (t)
    {
        if (!strcmp(name, (*t)->t_name))
            break;
        t = soundfile_nexttype(t);
    }
    return (t ? *t : NULL);
}